

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

void __thiscall
FPlayerNameBox::FPlayerNameBox
          (FPlayerNameBox *this,int x,int y,int height,int frameofs,char *text,FFont *font,
          EColorRange color,FName action)

{
  FName local_24;
  
  FListMenuItemSelectable::FListMenuItemSelectable
            (&this->super_FListMenuItemSelectable,x,y,height,&local_24,-1);
  (this->super_FListMenuItemSelectable).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FPlayerNameBox_006e8ef0;
  (this->mText).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FString::operator=(&this->mText,text);
  this->mFont = font;
  this->mFontColor = color;
  this->mFrameSize = frameofs;
  this->mPlayerName[0] = '\0';
  this->mEntering = false;
  return;
}

Assistant:

FPlayerNameBox::FPlayerNameBox(int x, int y, int height, int frameofs, const char *text, FFont *font, EColorRange color, FName action)
: FListMenuItemSelectable(x, y, height, action)
{
	mText = text;
	mFont = font;
	mFontColor = color;
	mFrameSize = frameofs;
	mPlayerName[0] = 0;
	mEntering = false;
}